

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# membrane-test.c++
# Opt level: O2

Promise<void> __thiscall
capnp::_::anon_unknown_0::TestMembraneImpl::callPassThrough
          (TestMembraneImpl *this,CallPassThroughContext context)

{
  _func_int *p_Var1;
  void *pvVar2;
  size_t in_RCX;
  CallContextHook *in_RDX;
  void *__buf;
  int in_R8D;
  SimpleTransformPromiseNode<capnp::Response<capnproto_test::capnp::test::TestMembrane::Result>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_membrane_test_c__:68:11)>
  *location;
  void *continuationTracePtr;
  Request<capnproto_test::capnp::test::TestMembrane::Thing::PassThroughParams,_capnproto_test::capnp::test::TestMembrane::Result>
  req;
  Reader params;
  anon_class_8_1_bc11688f_for_func local_f8;
  CallContext<capnproto_test::capnp::test::TestMembrane::CallPassThroughParams,_capnproto_test::capnp::test::TestMembrane::Result>
  local_f0;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_e8;
  code *local_e0;
  undefined1 local_d8 [48];
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_a8;
  Request<capnproto_test::capnp::test::TestMembrane::Thing::PassThroughParams,_capnproto_test::capnp::test::TestMembrane::Result>
  local_a0;
  Reader local_68;
  Maybe<capnp::MessageSize> local_38;
  
  local_f0.hook = in_RDX;
  CallContext<capnproto_test::capnp::test::TestMembrane::CallPassThroughParams,_capnproto_test::capnp::test::TestMembrane::Result>
  ::getParams(&local_68,&local_f0);
  capnproto_test::capnp::test::TestMembrane::CallPassThroughParams::Reader::getThing
            ((Client *)local_d8,&local_68);
  local_38.ptr.isSet = false;
  capnproto_test::capnp::test::TestMembrane::Thing::Client::passThroughRequest
            (&local_a0,(Client *)local_d8,&local_38);
  kj::Own<capnp::ClientHook,_std::nullptr_t>::dispose
            ((Own<capnp::ClientHook,_std::nullptr_t> *)(local_d8 + 8));
  if ((local_68._reader.dataSize == 0) || ((*local_68._reader.data & 1) == 0)) {
    Request<capnproto_test::capnp::test::TestMembrane::Thing::PassThroughParams,_capnproto_test::capnp::test::TestMembrane::Result>
    ::send((Request<capnproto_test::capnp::test::TestMembrane::Thing::PassThroughParams,_capnproto_test::capnp::test::TestMembrane::Result>
            *)local_d8,(int)&local_a0,__buf,in_RCX,in_R8D);
    local_f8.context.hook = (CallPassThroughContext)(CallPassThroughContext)local_f0.hook;
    local_e0 = kj::_::
               SimpleTransformPromiseNode<capnp::Response<capnproto_test::capnp::test::TestMembrane::Result>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/membrane-test.c++:68:11)>
               ::anon_class_8_1_bc11688f_for_func::operator();
    p_Var1 = *(_func_int **)&((SegmentReader *)local_d8._0_8_)->id;
    if (p_Var1 == (_func_int *)0x0 || (ulong)(local_d8._0_8_ - (long)p_Var1) < 0x28) {
      pvVar2 = operator_new(0x400);
      location = (SimpleTransformPromiseNode<capnp::Response<capnproto_test::capnp::test::TestMembrane::Result>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_membrane_test_c__:68:11)>
                  *)((long)pvVar2 + 0x3d8);
      kj::
      ctor<kj::_::SimpleTransformPromiseNode<capnp::Response<capnproto_test::capnp::test::TestMembrane::Result>,capnp::_::(anonymous_namespace)::TestMembraneImpl::callPassThrough(capnp::CallContext<capnproto_test::capnp::test::TestMembrane::CallPassThroughParams,capnproto_test::capnp::test::TestMembrane::Result>)::_lambda(capnp::Response<capnproto_test::capnp::test::TestMembrane::Result>&&)_1_>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,capnp::_::(anonymous_namespace)::TestMembraneImpl::callPassThrough(capnp::CallContext<capnproto_test::capnp::test::TestMembrane::CallPassThroughParams,capnproto_test::capnp::test::TestMembrane::Result>)::_lambda(capnp::Response<capnproto_test::capnp::test::TestMembrane::Result>&&)_1_,void*&>
                (location,(Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)local_d8,&local_f8,
                 &local_e0);
      *(void **)((long)pvVar2 + 0x3e0) = pvVar2;
    }
    else {
      *(undefined8 *)&((SegmentReader *)local_d8._0_8_)->id = 0;
      location = (SimpleTransformPromiseNode<capnp::Response<capnproto_test::capnp::test::TestMembrane::Result>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_membrane_test_c__:68:11)>
                  *)((SegmentId *)(local_d8._0_8_ + -0x30) + 2);
      kj::
      ctor<kj::_::SimpleTransformPromiseNode<capnp::Response<capnproto_test::capnp::test::TestMembrane::Result>,capnp::_::(anonymous_namespace)::TestMembraneImpl::callPassThrough(capnp::CallContext<capnproto_test::capnp::test::TestMembrane::CallPassThroughParams,capnproto_test::capnp::test::TestMembrane::Result>)::_lambda(capnp::Response<capnproto_test::capnp::test::TestMembrane::Result>&&)_1_>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,capnp::_::(anonymous_namespace)::TestMembraneImpl::callPassThrough(capnp::CallContext<capnproto_test::capnp::test::TestMembrane::CallPassThroughParams,capnproto_test::capnp::test::TestMembrane::Result>)::_lambda(capnp::Response<capnproto_test::capnp::test::TestMembrane::Result>&&)_1_,void*&>
                (location,(Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)local_d8,&local_f8,
                 &local_e0);
      *(_func_int **)(local_d8._0_8_ + -0x20) = p_Var1;
    }
    local_e8.ptr = (PromiseNode *)0x0;
    (this->super_Server)._vptr_Server = (_func_int **)location;
    local_a8.ptr = (PromiseNode *)0x0;
    kj::Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_a8);
    kj::Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_e8);
    RemotePromise<capnproto_test::capnp::test::TestMembrane::Result>::~RemotePromise
              ((RemotePromise<capnproto_test::capnp::test::TestMembrane::Result> *)local_d8);
  }
  else {
    (*(local_f0.hook)->_vptr_CallContextHook[3])(this,local_f0.hook,&local_a0.hook);
  }
  kj::Own<capnp::RequestHook,_std::nullptr_t>::dispose(&local_a0.hook);
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<void> callPassThrough(CallPassThroughContext context) override {
    auto params = context.getParams();
    auto req = params.getThing().passThroughRequest();
    if (params.getTailCall()) {
      return context.tailCall(kj::mv(req));
    } else {
      return req.send().then(
          [KJ_CPCAP(context)](Response<test::TestMembrane::Result>&& result) mutable {
        context.setResults(result);
      });
    }